

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v10::detail::check_char_specs<char>(format_specs<char> *specs)

{
  format_specs<char> *specs_local;
  
  if (((specs->type == none) || (specs->type == chr)) || (specs->type == debug)) {
    if (((((byte)*(undefined2 *)&specs->field_0x9 & 0xf) == 4) ||
        ((*(ushort *)&specs->field_0x9 >> 4 & 7) != 0)) ||
       ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0)) {
      throw_format_error("invalid format specifier for char");
    }
    specs_local._7_1_ = true;
  }
  else {
    specs_local._7_1_ = false;
  }
  return specs_local._7_1_;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const format_specs<Char>& specs) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr &&
      specs.type != presentation_type::debug) {
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    throw_format_error("invalid format specifier for char");
  return true;
}